

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::impl::anon_unknown_0::xpath_lexer::next(xpath_lexer *this)

{
  byte bVar1;
  bool bVar2;
  byte *pbStack_18;
  char_t terminator;
  char_t *cur;
  xpath_lexer *this_local;
  
  pbStack_18 = (byte *)this->_cur;
  while (((anonymous_namespace)::chartype_table[*pbStack_18] & 8) != 0) {
    pbStack_18 = pbStack_18 + 1;
  }
  this->_cur_lexeme_pos = (char_t *)pbStack_18;
  switch(*pbStack_18) {
  case 0:
    this->_cur_lexeme = lex_eof;
    break;
  default:
    if (((anonymous_namespace)::chartypex_table[*pbStack_18] & 8) == 0) {
      if (((anonymous_namespace)::chartypex_table[*pbStack_18] & 4) == 0) {
        this->_cur_lexeme = lex_none;
      }
      else {
        (this->_cur_lexeme_contents).begin = (char_t *)pbStack_18;
        while (((anonymous_namespace)::chartypex_table[*pbStack_18] & 0x10) != 0) {
          pbStack_18 = pbStack_18 + 1;
        }
        if (*pbStack_18 == 0x3a) {
          if (pbStack_18[1] == 0x2a) {
            pbStack_18 = pbStack_18 + 2;
          }
          else {
            bVar1 = (anonymous_namespace)::chartypex_table[pbStack_18[1]];
            while ((bVar1 & 0x10) != 0) {
              pbStack_18 = pbStack_18 + 1;
              bVar1 = (anonymous_namespace)::chartypex_table[*pbStack_18];
            }
          }
        }
        (this->_cur_lexeme_contents).end = (char_t *)pbStack_18;
        this->_cur_lexeme = lex_string;
      }
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbStack_18;
      while (((anonymous_namespace)::chartypex_table[*pbStack_18] & 8) != 0) {
        pbStack_18 = pbStack_18 + 1;
      }
      if (*pbStack_18 == 0x2e) {
        do {
          pbStack_18 = pbStack_18 + 1;
        } while (((anonymous_namespace)::chartypex_table[*pbStack_18] & 8) != 0);
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbStack_18;
      this->_cur_lexeme = lex_number;
    }
    break;
  case 0x21:
    if (pbStack_18[1] == 0x3d) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_not_equal;
    }
    else {
      this->_cur_lexeme = lex_none;
    }
    break;
  case 0x22:
  case 0x27:
    bVar1 = *pbStack_18;
    pbStack_18 = pbStack_18 + 1;
    (this->_cur_lexeme_contents).begin = (char_t *)pbStack_18;
    while( true ) {
      bVar2 = false;
      if (*pbStack_18 != 0) {
        bVar2 = *pbStack_18 != bVar1;
      }
      if (!bVar2) break;
      pbStack_18 = pbStack_18 + 1;
    }
    (this->_cur_lexeme_contents).end = (char_t *)pbStack_18;
    if (*pbStack_18 == 0) {
      this->_cur_lexeme = lex_none;
    }
    else {
      pbStack_18 = pbStack_18 + 1;
      this->_cur_lexeme = lex_quoted_string;
    }
    break;
  case 0x24:
    pbStack_18 = pbStack_18 + 1;
    if (((anonymous_namespace)::chartypex_table[*pbStack_18] & 4) == 0) {
      this->_cur_lexeme = lex_none;
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbStack_18;
      while (((anonymous_namespace)::chartypex_table[*pbStack_18] & 0x10) != 0) {
        pbStack_18 = pbStack_18 + 1;
      }
      if (*pbStack_18 == 0x3a) {
        bVar1 = (anonymous_namespace)::chartypex_table[pbStack_18[1]];
        while ((bVar1 & 0x10) != 0) {
          pbStack_18 = pbStack_18 + 1;
          bVar1 = (anonymous_namespace)::chartypex_table[*pbStack_18];
        }
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbStack_18;
      this->_cur_lexeme = lex_var_ref;
    }
    break;
  case 0x28:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_open_brace;
    break;
  case 0x29:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_close_brace;
    break;
  case 0x2a:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_multiply;
    break;
  case 0x2b:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_plus;
    break;
  case 0x2c:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_comma;
    break;
  case 0x2d:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_minus;
    break;
  case 0x2e:
    if (pbStack_18[1] == 0x2e) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_double_dot;
    }
    else if (((anonymous_namespace)::chartypex_table[pbStack_18[1]] & 8) == 0) {
      pbStack_18 = pbStack_18 + 1;
      this->_cur_lexeme = lex_dot;
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbStack_18;
      do {
        pbStack_18 = pbStack_18 + 1;
      } while (((anonymous_namespace)::chartypex_table[*pbStack_18] & 8) != 0);
      (this->_cur_lexeme_contents).end = (char_t *)pbStack_18;
      this->_cur_lexeme = lex_number;
    }
    break;
  case 0x2f:
    if (pbStack_18[1] == 0x2f) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_double_slash;
    }
    else {
      pbStack_18 = pbStack_18 + 1;
      this->_cur_lexeme = lex_slash;
    }
    break;
  case 0x3a:
    if (pbStack_18[1] == 0x3a) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_double_colon;
    }
    else {
      this->_cur_lexeme = lex_none;
    }
    break;
  case 0x3c:
    if (pbStack_18[1] == 0x3d) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_less_or_equal;
    }
    else {
      pbStack_18 = pbStack_18 + 1;
      this->_cur_lexeme = lex_less;
    }
    break;
  case 0x3d:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_equal;
    break;
  case 0x3e:
    if (pbStack_18[1] == 0x3d) {
      pbStack_18 = pbStack_18 + 2;
      this->_cur_lexeme = lex_greater_or_equal;
    }
    else {
      pbStack_18 = pbStack_18 + 1;
      this->_cur_lexeme = lex_greater;
    }
    break;
  case 0x40:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_axis_attribute;
    break;
  case 0x5b:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_open_square_brace;
    break;
  case 0x5d:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_close_square_brace;
    break;
  case 0x7c:
    pbStack_18 = pbStack_18 + 1;
    this->_cur_lexeme = lex_union;
  }
  this->_cur = (char_t *)pbStack_18;
  return;
}

Assistant:

void next()
		{
			const char_t* cur = _cur;

			while (PUGI__IS_CHARTYPE(*cur, ct_space)) ++cur;

			// save lexeme position for error reporting
			_cur_lexeme_pos = cur;

			switch (*cur)
			{
			case 0:
				_cur_lexeme = lex_eof;
				break;

			case '>':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_greater_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_greater;
				}
				break;

			case '<':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_less_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_less;
				}
				break;

			case '!':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_not_equal;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			case '=':
				cur += 1;
				_cur_lexeme = lex_equal;

				break;

			case '+':
				cur += 1;
				_cur_lexeme = lex_plus;

				break;

			case '-':
				cur += 1;
				_cur_lexeme = lex_minus;

				break;

			case '*':
				cur += 1;
				_cur_lexeme = lex_multiply;

				break;

			case '|':
				cur += 1;
				_cur_lexeme = lex_union;

				break;

			case '$':
				cur += 1;

				if (PUGI__IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI__IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':' && PUGI__IS_CHARTYPEX(cur[1], ctx_symbol)) // qname
					{
						cur++; // :

						while (PUGI__IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_var_ref;
				}
				else
				{
					_cur_lexeme = lex_none;
				}

				break;

			case '(':
				cur += 1;
				_cur_lexeme = lex_open_brace;

				break;

			case ')':
				cur += 1;
				_cur_lexeme = lex_close_brace;

				break;

			case '[':
				cur += 1;
				_cur_lexeme = lex_open_square_brace;

				break;

			case ']':
				cur += 1;
				_cur_lexeme = lex_close_square_brace;

				break;

			case ',':
				cur += 1;
				_cur_lexeme = lex_comma;

				break;

			case '/':
				if (*(cur+1) == '/')
				{
					cur += 2;
					_cur_lexeme = lex_double_slash;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_slash;
				}
				break;

			case '.':
				if (*(cur+1) == '.')
				{
					cur += 2;
					_cur_lexeme = lex_double_dot;
				}
				else if (PUGI__IS_CHARTYPEX(*(cur+1), ctx_digit))
				{
					_cur_lexeme_contents.begin = cur; // .

					++cur;

					while (PUGI__IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_dot;
				}
				break;

			case '@':
				cur += 1;
				_cur_lexeme = lex_axis_attribute;

				break;

			case '"':
			case '\'':
			{
				char_t terminator = *cur;

				++cur;

				_cur_lexeme_contents.begin = cur;
				while (*cur && *cur != terminator) cur++;
				_cur_lexeme_contents.end = cur;

				if (!*cur)
					_cur_lexeme = lex_none;
				else
				{
					cur += 1;
					_cur_lexeme = lex_quoted_string;
				}

				break;
			}

			case ':':
				if (*(cur+1) == ':')
				{
					cur += 2;
					_cur_lexeme = lex_double_colon;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			default:
				if (PUGI__IS_CHARTYPEX(*cur, ctx_digit))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI__IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					if (*cur == '.')
					{
						cur++;

						while (PUGI__IS_CHARTYPEX(*cur, ctx_digit)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else if (PUGI__IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI__IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':')
					{
						if (cur[1] == '*') // namespace test ncname:*
						{
							cur += 2; // :*
						}
						else if (PUGI__IS_CHARTYPEX(cur[1], ctx_symbol)) // namespace test qname
						{
							cur++; // :

							while (PUGI__IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
						}
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_string;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
			}

			_cur = cur;
		}